

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end;
  size_t sVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out_00;
  buffer_appender<char> out_01;
  bool bVar2;
  type tVar3;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end_00;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar4;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *begin;
  size_t __n;
  ulong uVar5;
  char *pcVar6;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end_01;
  unkbyte10 in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff52;
  writer wStack_a8;
  writer write;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_88;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  
  pcVar6 = (char *)format_str.size_;
  begin = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)format_str.data_;
  h.parse_context.format_str_.data_ = (char *)args.field_1;
  h._0_8_ = args.desc_;
  if ((pcVar6 != (char *)0x2) || (*(short *)begin != 0x7d7b)) {
    h.parse_context.format_str_.size_ = h.parse_context.format_str_.size_ & 0xffffffff00000000;
    end = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)(pcVar6 + (long)&begin->field_0x0);
    h.parse_context._16_8_ =
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    h.context.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h._0_8_;
    h.context.args_.desc_ = (unsigned_long_long)h.parse_context.format_str_.data_;
    h.context.args_.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
          )loc.locale_;
    if ((long)pcVar6 < 0x20) {
      pfVar4 = begin;
      if (pcVar6 != (char *)0x0) {
        end_01 = begin;
        do {
          h.parse_context.format_str_.data_ = pcVar6;
          h._0_8_ = pfVar4;
          end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&end_01->field_0x1;
          if (*(char *)end_01 == '}') {
            if ((end_00 == end) || (*(char *)end_00 != '}')) {
              detail::error_handler::on_error
                        ((error_handler *)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                         "unmatched \'}\' in format string");
            }
            out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_88;
            detail::
            format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)begin,(char *)end_00);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&end_01->field_0x2;
            begin = end_00;
          }
          else if (*(char *)end_01 == '{') {
            detail::
            format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_88,(char *)begin,(char *)end_01);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)detail::
                        parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                  ((char *)end_01,(char *)end,
                                   (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                    *)&local_88);
            out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)end_01;
            begin = end_00;
          }
          end_01 = end_00;
          pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)h._0_8_;
          pcVar6 = h.parse_context.format_str_.data_;
        } while (end_00 != end);
      }
      h.parse_context.format_str_.data_ = pcVar6;
      h._0_8_ = pfVar4;
      detail::
      format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)&local_88,(char *)begin,(char *)end);
      return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
    }
    wStack_a8.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)&local_88;
    pfVar4 = begin;
    do {
      h.parse_context.format_str_.data_ = pcVar6;
      h._0_8_ = pfVar4;
      if (begin == end) {
        return (iterator)
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
      }
      pfVar4 = begin;
      if (*(char *)begin == '{') {
LAB_0022b2f2:
        detail::
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()(&wStack_a8,(char *)begin,(char *)pfVar4);
        begin = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)detail::
                   parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                             ((char *)pfVar4,(char *)end,
                              (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_88);
        bVar2 = true;
      }
      else {
        __n = (long)end - (long)&begin->field_0x1;
        if ((long)__n < 0) {
          detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                              ,0x13c,"negative value");
        }
        pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)memchr(&begin->field_0x1,0x7b,__n);
        if (pfVar4 != (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)0x0) goto LAB_0022b2f2;
        detail::
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()(&wStack_a8,(char *)begin,(char *)end);
        bVar2 = false;
      }
      pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)h._0_8_;
      pcVar6 = h.parse_context.format_str_.data_;
      if (!bVar2) {
        return (iterator)
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
      }
    } while( true );
  }
  h.context.loc_.locale_._0_4_ = 0.0;
  if ((long)h._0_8_ < 0) {
    if ((int)(type)args.desc_ < 1) {
      tVar3 = none_type;
    }
    else {
      sVar1 = (((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)h.parse_context.format_str_.data_)->field_0).string.size;
      h.context.loc_.locale_._0_4_ =
           (float)(((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)h.parse_context.format_str_.data_)->field_0).long_long_value;
      h.context.loc_.locale_._4_4_ =
           (undefined4)
           ((ulong)(((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)h.parse_context.format_str_.data_)->field_0).long_long_value >> 0x20);
      uStack_40 = (undefined2)sVar1;
      uStack_3e = (undefined6)(sVar1 >> 0x10);
      tVar3 = ((format_arg *)h.parse_context.format_str_.data_)->type_;
    }
  }
  else {
    tVar3 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
      sVar1 = (((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)h.parse_context.format_str_.data_)->field_0).string.size;
      h.context.loc_.locale_._0_4_ =
           (float)(((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)h.parse_context.format_str_.data_)->field_0).long_long_value;
      h.context.loc_.locale_._4_4_ =
           (undefined4)
           ((ulong)(((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)h.parse_context.format_str_.data_)->field_0).long_long_value >> 0x20);
      uStack_40 = (undefined2)sVar1;
      uStack_3e = (undefined6)(sVar1 >> 0x10);
    }
  }
  local_88 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  switch(tVar3) {
  case none_type:
    detail::error_handler::on_error
              ((error_handler *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               "argument not found");
  case int_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (int)h.context.loc_.locale_._0_4_);
    break;
  case uint_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (uint)h.context.loc_.locale_._0_4_);
    break;
  case long_long_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_));
    break;
  case ulong_long_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_));
    break;
  case int128_type:
    out_01.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         h.context.loc_.locale_._4_4_;
    out_01.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         h.context.loc_.locale_._0_4_;
    value_00._10_6_ = in_stack_ffffffffffffff52;
    value_00._0_10_ = in_stack_ffffffffffffff48;
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,out_01,
                    (__int128)value_00);
    break;
  case uint128_type:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         h.context.loc_.locale_._4_4_;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         h.context.loc_.locale_._0_4_;
    value._10_6_ = in_stack_ffffffffffffff52;
    value._0_10_ = in_stack_ffffffffffffff48;
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,out_00,
                    (unsigned___int128)value);
    break;
  case bool_type:
    pcVar6 = "false";
    if (((uint)h.context.loc_.locale_._0_4_ & 1) != 0) {
      pcVar6 = "true";
    }
    uVar5 = (ulong)((uint)h.context.loc_.locale_._0_4_ & 1) ^ 5;
    goto LAB_0022b44d;
  case char_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,fmt::v7::detail::buffer_appender<char>>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (char)h.context.loc_.locale_);
    break;
  case float_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    h.context.loc_.locale_._0_4_);
    break;
  case double_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (double)CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_));
    break;
  case last_numeric_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (longdouble)
                    CONCAT28(uStack_40,
                             CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_)));
    break;
  case cstring_type:
    local_88.container =
         (buffer<char> *)
         detail::write<char,fmt::v7::detail::buffer_appender<char>>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (char *)CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_));
    break;
  case string_type:
    pcVar6 = (char *)CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_);
    uVar5 = CONCAT62(uStack_3e,uStack_40);
LAB_0022b44d:
    detail::buffer<char>::append<char>
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,pcVar6,
               pcVar6 + uVar5);
    break;
  case pointer_type:
    local_88.container =
         (buffer<char> *)
         detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_),
                    (basic_format_specs<char> *)0x0);
    break;
  case custom_type:
    wStack_a8.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    write.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    h.parse_context.format_str_.size_ = (size_t)loc.locale_;
    (*(code *)CONCAT62(uStack_3e,uStack_40))
              (CONCAT44(h.context.loc_.locale_._4_4_,h.context.loc_.locale_._0_4_),&wStack_a8,
               &local_88);
    break;
  default:
    detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                        ,0x6d7,"");
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_88.container;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}